

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateViewIndexAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  uint32_t operand;
  bool bVar1;
  StorageClass SVar2;
  spv_result_t sVar3;
  _Rb_tree_node_base *p_Var4;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *__position;
  undefined8 *puVar5;
  DiagnosticStream *pDVar6;
  spv_operand_desc desc;
  undefined1 local_270 [32];
  _Any_data local_250;
  code *local_240;
  code *local_238;
  string local_230;
  char *local_210;
  undefined1 local_208 [16];
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  BuiltInsValidator *local_c0;
  
  if (decoration->dec_type_ != BuiltIn) {
    __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/decoration.h"
                  ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
  }
  operand = *(decoration->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    SVar2 = GetStorageClass((anon_unknown_0 *)
                            (referenced_from_inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (Instruction *)(ulong)(referenced_from_inst->inst_).opcode);
    if ((SVar2 != Input) && (SVar2 != Max)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_250,this->_,0x1132,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_250._M_unused._0_8_,local_250._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Vulkan spec allows BuiltIn ",0x1b);
      local_270._0_8_ = (spv_operand_desc)0x0;
      sVar3 = AssemblyGrammar::lookupOperand
                        (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand,
                         (spv_operand_desc *)local_270);
      if ((spv_operand_desc)local_270._0_8_ == (spv_operand_desc)0x0 || sVar3 != SPV_SUCCESS) {
        local_210 = "Unknown";
      }
      else {
        local_210 = *(char **)local_270._0_8_;
      }
      pDVar6 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6," to be only used for variables with Input storage class. ",0x39)
      ;
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                ((string *)local_270,this,decoration,built_in_inst,referenced_inst,
                 referenced_from_inst,ExecutionModelMax);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6,(char *)local_270._0_8_,local_270._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6," ",1);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_230,this,referenced_from_inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
      sVar3 = pDVar6->error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
LAB_001a141b:
      if ((spv_operand_desc)local_270._0_8_ != (spv_operand_desc)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((code **)local_250._M_unused._0_8_ != &local_240) {
        operator_delete(local_250._M_unused._M_object,(ulong)(local_240 + 1));
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return sVar3;
    }
    for (p_Var4 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (p_Var4[1]._M_color == 5) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_250,this->_,0x1131,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_250._M_unused._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Vulkan spec allows BuiltIn ",0x1b);
        local_270._0_8_ = (spv_operand_desc)0x0;
        sVar3 = AssemblyGrammar::lookupOperand
                          (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand,
                           (spv_operand_desc *)local_270);
        if ((spv_operand_desc)local_270._0_8_ == (spv_operand_desc)0x0 || sVar3 != SPV_SUCCESS) {
          local_230._M_dataplus._M_p = "Unknown";
        }
        else {
          local_230._M_dataplus._M_p = *(pointer *)local_270._0_8_;
        }
        pDVar6 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar6," to be not be used with GLCompute execution model. ",0x33);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  ((string *)local_270,this,decoration,built_in_inst,referenced_inst,
                   referenced_from_inst,ExecutionModelGLCompute);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar6,(char *)local_270._0_8_,local_270._8_8_);
        sVar3 = pDVar6->error_;
        goto LAB_001a141b;
      }
    }
  }
  if (this->function_id_ == 0) {
    local_270._0_4_ = (referenced_from_inst->inst_).result_id;
    __position = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](&this->id_to_at_reference_checks_,(key_type_conflict *)local_270);
    local_208._0_8_ = ValidateViewIndexAtReference;
    local_208._8_8_ = 0;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_250._8_8_ = 0;
    local_c0 = this;
    puVar5 = (undefined8 *)operator_new(0x150);
    *puVar5 = local_208._0_8_;
    puVar5[1] = local_208._8_8_;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                   *)(puVar5 + 2),&local_1f8);
    puVar5[0x29] = local_c0;
    local_238 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_invoke;
    local_240 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_manager;
    local_250._M_unused._M_object = puVar5;
    std::__cxx11::
    list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
    ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
              (__position,(iterator)__position,
               (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
    if (local_240 != (code *)0x0) {
      (*local_240)(&local_250,&local_250,3);
    }
    if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl
                      .params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateViewIndexAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  uint32_t operand = (uint32_t)decoration.builtin();
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4402) << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              operand)
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model == spv::ExecutionModel::GLCompute) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4401) << "Vulkan spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                operand)
               << " to be not be used with GLCompute execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateViewIndexAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}